

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall
cmake::GetSystemInformation
          (cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmState *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  cmGlobalGenerator *gg;
  char *pcVar6;
  ostream *poVar7;
  FILE *__stream;
  size_t sVar8;
  bool in_DL;
  uint uVar9;
  char *c;
  ulong uVar10;
  string *psVar11;
  string modulesPath;
  string resultFile;
  string destPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  string outFile;
  string inFile;
  string cwd;
  string resultArg;
  string arg;
  
  resultFile._M_dataplus._M_p = (pointer)&resultFile.field_2;
  resultFile._M_string_length = 0;
  resultFile.field_2._M_local_buf[0] = '\0';
  iVar4 = 1;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&cwd,(SystemTools *)0x1,in_DL);
  std::operator+(&destPath,&cwd,"/__cmake_systeminformation");
  cmsys::SystemTools::RemoveADirectory(&destPath);
  bVar2 = cmsys::SystemTools::MakeDirectory(destPath._M_dataplus._M_p);
  if (bVar2) {
    bVar2 = true;
    uVar10 = 1;
    do {
      uVar9 = (uint)uVar10;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar10)
      {
        AddCMakePaths(this);
        this_00 = this->State;
        std::__cxx11::string::string((string *)&arg,"CMAKE_ROOT",(allocator *)&inFile);
        pcVar6 = cmState::GetInitializedCacheValue(this_00,&arg);
        std::__cxx11::string::string((string *)&modulesPath,pcVar6,(allocator *)&outFile);
        std::__cxx11::string::~string((string *)&arg);
        std::__cxx11::string::append((char *)&modulesPath);
        std::__cxx11::string::string((string *)&inFile,(string *)&modulesPath);
        std::__cxx11::string::append((char *)&inFile);
        std::__cxx11::string::string((string *)&outFile,(string *)&destPath);
        std::__cxx11::string::append((char *)&outFile);
        bVar3 = cmSystemTools::cmCopyFile(inFile._M_dataplus._M_p,outFile._M_dataplus._M_p);
        if (bVar3) {
          if (resultFile._M_string_length == 0) {
            std::__cxx11::string::_M_assign((string *)&resultFile);
            std::__cxx11::string::append((char *)&resultFile);
          }
          cmsys::SystemTools::ChangeDirectory(&destPath);
          args2.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          args2.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          args2.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&args2,(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&args2,&destPath);
          std::__cxx11::string::string((string *)&resultArg,"-DRESULT_FILE=",(allocator *)&arg);
          std::__cxx11::string::append((string *)&resultArg);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&args2,&resultArg);
          iVar4 = Run(this,&args2,false);
          if (iVar4 == 0) {
            cmsys::SystemTools::ChangeDirectory(&cwd);
            if ((bVar2) &&
               (__stream = (FILE *)cmsys::SystemTools::Fopen(&resultFile,"r"),
               __stream != (FILE *)0x0)) {
              while (sVar8 = fread(&arg,1,0x1000,__stream), sVar8 != 0) {
                for (psVar11 = &arg; psVar11 < (string *)((long)&arg._M_dataplus._M_p + sVar8);
                    psVar11 = (string *)((long)&(psVar11->_M_dataplus)._M_p + 1)) {
                  putc((int)*(char *)&(psVar11->_M_dataplus)._M_p,_stdout);
                }
                fflush(_stdout);
              }
              fclose(__stream);
            }
            iVar4 = 0;
            cmsys::SystemTools::RemoveADirectory(&destPath);
          }
          else {
            std::operator<<((ostream *)&std::cerr,
                            "Error: --system-information failed on internal CMake!\n");
          }
          std::__cxx11::string::~string((string *)&resultArg);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&args2);
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Error copying file \"");
          poVar7 = std::operator<<(poVar7,(string *)&inFile);
          poVar7 = std::operator<<(poVar7,"\" to \"");
          poVar7 = std::operator<<(poVar7,(string *)&outFile);
          std::operator<<(poVar7,"\".\n");
          iVar4 = 1;
        }
        std::__cxx11::string::~string((string *)&outFile);
        std::__cxx11::string::~string((string *)&inFile);
        std::__cxx11::string::~string((string *)&modulesPath);
        goto LAB_00331d14;
      }
      std::__cxx11::string::string((string *)&arg,(string *)(pbVar1 + uVar10));
      lVar5 = std::__cxx11::string::find((char *)&arg,0x495781);
      if (lVar5 == 0) {
        this->Verbose = true;
        bVar3 = true;
      }
      else {
        lVar5 = std::__cxx11::string::find((char *)&arg,0x4ab394);
        if (lVar5 == 0) {
          std::__cxx11::string::substr((ulong)&modulesPath,(ulong)&arg);
          if (modulesPath._M_string_length == 0) {
            uVar9 = uVar9 + 1;
            if ((ulong)uVar9 <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::__cxx11::string::_M_assign((string *)&modulesPath);
              goto LAB_003319ab;
            }
            cmSystemTools::Error
                      ("No generator specified for -G",(char *)0x0,(char *)0x0,(char *)0x0);
            PrintGeneratorList(this);
            bVar3 = false;
          }
          else {
LAB_003319ab:
            gg = CreateGlobalGenerator(this,&modulesPath);
            if (gg == (cmGlobalGenerator *)0x0) {
              cmSystemTools::Error
                        ("Could not create named generator ",modulesPath._M_dataplus._M_p,
                         (char *)0x0,(char *)0x0);
              bVar3 = true;
              PrintGeneratorList(this);
            }
            else {
              bVar3 = true;
              SetGlobalGenerator(this,gg);
            }
          }
          std::__cxx11::string::~string((string *)&modulesPath);
        }
        else {
          bVar2 = cmsys::SystemTools::FileIsFullPath(arg._M_dataplus._M_p);
          if (!bVar2) {
            std::__cxx11::string::_M_assign((string *)&resultFile);
            std::__cxx11::string::append((char *)&resultFile);
          }
          std::__cxx11::string::append((string *)&resultFile);
          bVar3 = true;
          bVar2 = false;
        }
      }
      std::__cxx11::string::~string((string *)&arg);
      uVar10 = (ulong)(uVar9 + 1);
    } while (bVar3);
    iVar4 = -1;
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "Error: --system-information must be run from a writable directory!\n");
  }
LAB_00331d14:
  std::__cxx11::string::~string((string *)&destPath);
  std::__cxx11::string::~string((string *)&cwd);
  std::__cxx11::string::~string((string *)&resultFile);
  return iVar4;
}

Assistant:

int cmake::GetSystemInformation(std::vector<std::string>& args)
{
  // so create the directory
  std::string resultFile;
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  std::string destPath = cwd + "/__cmake_systeminformation";
  cmSystemTools::RemoveADirectory(destPath);
  if (!cmSystemTools::MakeDirectory(destPath.c_str()))
    {
    std::cerr << "Error: --system-information must be run from a "
      "writable directory!\n";
    return 1;
    }

  // process the arguments
  bool writeToStdout = true;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-V",0) == 0)
      {
      this->Verbose = true;
      }
    else if(arg.find("-G",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return -1;
          }
        value = args[i];
        }
      cmGlobalGenerator* gen =
        this->CreateGlobalGenerator(value);
      if(!gen)
        {
        cmSystemTools::Error("Could not create named generator ",
                             value.c_str());
        this->PrintGeneratorList();
        }
      else
        {
        this->SetGlobalGenerator(gen);
        }
      }
    // no option assume it is the output file
    else
      {
      if (!cmSystemTools::FileIsFullPath(arg.c_str()))
        {
        resultFile = cwd;
        resultFile += "/";
        }
      resultFile += arg;
      writeToStdout = false;
      }
    }


  // we have to find the module directory, so we can copy the files
  this->AddCMakePaths();
  std::string modulesPath =
    this->State->GetInitializedCacheValue("CMAKE_ROOT");
  modulesPath += "/Modules";
  std::string inFile = modulesPath;
  inFile += "/SystemInformation.cmake";
  std::string outFile = destPath;
  outFile += "/CMakeLists.txt";

  // Copy file
  if(!cmSystemTools::cmCopyFile(inFile.c_str(), outFile.c_str()))
    {
    std::cerr << "Error copying file \"" << inFile
              << "\" to \"" << outFile << "\".\n";
    return 1;
    }

  // do we write to a file or to stdout?
  if (resultFile.empty())
    {
    resultFile = cwd;
    resultFile += "/__cmake_systeminformation/results.txt";
    }

  // now run cmake on the CMakeLists file
  cmSystemTools::ChangeDirectory(destPath);
  std::vector<std::string> args2;
  args2.push_back(args[0]);
  args2.push_back(destPath);
  std::string resultArg = "-DRESULT_FILE=";
  resultArg += resultFile;
  args2.push_back(resultArg);
  int res = this->Run(args2, false);

  if (res != 0)
    {
    std::cerr << "Error: --system-information failed on internal CMake!\n";
    return res;
    }

  // change back to the original directory
  cmSystemTools::ChangeDirectory(cwd);

  // echo results to stdout if needed
  if (writeToStdout)
    {
    FILE* fin = cmsys::SystemTools::Fopen(resultFile, "r");
    if(fin)
      {
      const int bufferSize = 4096;
      char buffer[bufferSize];
      size_t n;
      while((n = fread(buffer, 1, bufferSize, fin)) > 0)
        {
        for(char* c = buffer; c < buffer+n; ++c)
          {
          putc(*c, stdout);
          }
        fflush(stdout);
        }
      fclose(fin);
      }
    }

  // clean up the directory
  cmSystemTools::RemoveADirectory(destPath);
  return 0;
}